

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

int chaiscript::Boxed_Number::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Boxed_Value local_48;
  undefined1 local_38 [32];
  Boxed_Value *local_18;
  Boxed_Value *t_bv_local;
  
  local_18 = (Boxed_Value *)__child_stack;
  t_bv_local = (Boxed_Value *)__fn;
  Boxed_Value::Boxed_Value(&local_48,(Boxed_Value *)__child_stack);
  Boxed_Number((Boxed_Number *)local_38,&local_48);
  Boxed_Value::get_type_info(local_18);
  get_as((Boxed_Number *)(local_38 + 0x10),(Type_Info *)local_38);
  Boxed_Value::Boxed_Value((Boxed_Value *)__fn,(Boxed_Value *)(local_38 + 0x10));
  ~Boxed_Number((Boxed_Number *)(local_38 + 0x10));
  ~Boxed_Number((Boxed_Number *)local_38);
  Boxed_Value::~Boxed_Value(&local_48);
  return (int)__fn;
}

Assistant:

static Boxed_Value clone(const Boxed_Value &t_bv) { return Boxed_Number(t_bv).get_as(t_bv.get_type_info()).bv; }